

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

void * unqlite_context_realloc_chunk(unqlite_context *pCtx,void *pChunk,uint nByte)

{
  void *pvVar1;
  jx9_aux_data *pjVar2;
  
  pvVar1 = SyMemBackendRealloc(&pCtx->pVm->sAllocator,pChunk,nByte);
  if (pvVar1 != (void *)0x0) {
    pjVar2 = ContextFindChunk(pCtx,pChunk);
    if (pjVar2 != (jx9_aux_data *)0x0) {
      pjVar2->pAuxData = pvVar1;
    }
  }
  return pvVar1;
}

Assistant:

void * unqlite_context_realloc_chunk(unqlite_context *pCtx,void *pChunk,unsigned int nByte)
{
	return jx9_context_realloc_chunk(pCtx,pChunk,nByte);
}